

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_binbuf.c
# Opt level: O1

void binbuf_text(_binbuf *x,char *text,size_t size)

{
  bool bVar1;
  int iVar2;
  t_atom *ptVar3;
  t_symbol *ptVar4;
  byte bVar5;
  long lVar6;
  byte *pbVar7;
  int newsize;
  uint uVar8;
  byte bVar9;
  uint uVar10;
  int iVar11;
  byte *pbVar12;
  bool bVar13;
  bool bVar14;
  double dVar15;
  char buf [1001];
  byte local_428 [1016];
  
  ptVar3 = (t_atom *)resizebytes(x->b_vec,(long)x->b_n << 4,0);
  x->b_vec = ptVar3;
  x->b_n = 0;
  ptVar3 = (t_atom *)resizebytes(ptVar3,0,0x100);
  if (ptVar3 == (t_atom *)0x0) {
    return;
  }
  pbVar12 = (byte *)(text + size);
  x->b_vec = ptVar3;
  x->b_n = 0x10;
  iVar11 = 0x10;
  newsize = 0;
  pbVar7 = (byte *)text;
joined_r0x00168b21:
  for (; (byte *)text != pbVar12; text = (char *)((byte *)text + 1)) {
    if ((0x20 < (ulong)(byte)*text) || ((0x100002600U >> ((ulong)(byte)*text & 0x3f) & 1) == 0)) {
      if ((byte *)text == pbVar12) break;
      if (*text == 0x2c) {
        ptVar3->a_type = A_COMMA;
      }
      else {
        if (*text != 0x3b) {
          bVar14 = true;
          uVar8 = 0;
          bVar1 = false;
          lVar6 = 0;
          text = (char *)(pbVar7 + 1);
          do {
            bVar5 = ((byte *)text)[-1];
            local_428[lVar6] = bVar5;
            if ((int)uVar8 < 0) goto LAB_00168cbd;
            bVar9 = bVar5 - 0x30;
            if (7 < uVar8) {
              uVar10 = 0xffffffff;
              if (bVar9 < 10) {
                uVar10 = uVar8;
              }
              bVar13 = uVar8 == 8;
LAB_00168cb9:
              if (bVar13) {
                uVar8 = uVar10;
              }
              goto LAB_00168cbd;
            }
            switch(uVar8) {
            case 0:
              uVar8 = 1;
              if (bVar5 != 0x2d) goto switchD_00168bd1_caseD_1;
              break;
            case 1:
switchD_00168bd1_caseD_1:
              uVar8 = (uint)(bVar5 == 0x2e) * 4 - 1;
              uVar10 = 2;
              goto LAB_00168c16;
            case 2:
              if ((bVar5 - 0x2e < 0x38) &&
                 ((0x80000000800001U >> ((ulong)(bVar5 - 0x2e) & 0x3f) & 1) != 0)) {
                uVar8 = (uint)(bVar5 != 0x2e) * 2 + 4;
              }
              else {
                uVar8 = (bVar9 < 10) - 1 | 2;
              }
              break;
            case 3:
              uVar8 = (bVar9 < 10) - 1 | 5;
              break;
            case 4:
              uVar8 = -(uint)((bVar5 & 0xdf) != 0x45) | 6;
              uVar10 = 5;
LAB_00168c16:
              if (bVar9 < 10) {
                uVar8 = uVar10;
              }
              break;
            case 5:
              uVar8 = (bVar9 < 10) - 1 | 5;
              bVar13 = (bVar5 & 0xdf) == 0x45;
              uVar10 = 6;
              goto LAB_00168cb9;
            case 6:
              uVar8 = 7;
              if ((bVar5 != 0x2b) && (bVar5 != 0x2d)) goto switchD_00168bd1_caseD_7;
              break;
            case 7:
switchD_00168bd1_caseD_7:
              uVar8 = (bVar9 < 10) - 1 | 8;
            }
LAB_00168cbd:
            if ((((bVar14) && (bVar5 == 0x24)) && ((byte *)text != pbVar12)) &&
               ((byte)(*text - 0x30U) < 10)) {
              bVar1 = true;
            }
            lVar6 = lVar6 + (ulong)(byte)(~bVar14 | bVar5 != 0x5c);
            if ((((byte *)text == pbVar12) || (lVar6 == 1000)) ||
               ((bVar14 = (bool)(bVar14 & bVar5 == 0x5c), !bVar14 &&
                (((ulong)(byte)*text < 0x3c &&
                 ((0x800100100002600U >> ((ulong)(byte)*text & 0x3f) & 1) != 0))))))
            goto LAB_00168d4f;
            bVar14 = (bool)(bVar14 ^ 1);
            text = (char *)((byte *)text + 1);
          } while( true );
        }
        ptVar3->a_type = A_SEMI;
      }
      (ptVar3->a_w).w_float = 0.0;
      text = (char *)((byte *)text + 1);
      goto LAB_00168d91;
    }
    pbVar7 = pbVar7 + 1;
  }
  bVar14 = false;
  goto LAB_00168b49;
LAB_00168d4f:
  local_428[lVar6] = 0;
  if ((uVar8 < 9) && ((0x134U >> (uVar8 & 0x1f) & 1) != 0)) {
    ptVar3->a_type = A_FLOAT;
    dVar15 = atof((char *)local_428);
    (ptVar3->a_w).w_float = (float)dVar15;
  }
  else {
    if (bVar1) {
      bVar14 = local_428[0] == 0x24;
      if (local_428[1] != 0) {
        pbVar7 = local_428 + 2;
        bVar5 = local_428[1];
        do {
          if ((byte)(bVar5 - 0x3a) < 0xf6) {
            bVar14 = false;
          }
          bVar5 = *pbVar7;
          pbVar7 = pbVar7 + 1;
        } while (bVar5 != 0);
      }
      if (bVar14) {
        ptVar3->a_type = A_DOLLAR;
        iVar2 = atoi((char *)(local_428 + 1));
        (ptVar3->a_w).w_index = iVar2;
        goto LAB_00168d91;
      }
      ptVar3->a_type = A_DOLLSYM;
    }
    else {
      ptVar3->a_type = A_SYMBOL;
    }
    ptVar4 = gensym((char *)local_428);
    (ptVar3->a_w).w_symbol = ptVar4;
  }
LAB_00168d91:
  ptVar3 = ptVar3 + 1;
  newsize = newsize + 1;
  if (newsize == iVar11) {
    iVar2 = binbuf_resize(x,iVar11 * 2);
    if (iVar2 == 0) {
      bVar14 = false;
      goto LAB_00168b49;
    }
    ptVar3 = x->b_vec + newsize;
    iVar11 = iVar11 * 2;
  }
  bVar14 = (byte *)text != pbVar12;
LAB_00168b49:
  pbVar7 = (byte *)text;
  if (!bVar14) {
    binbuf_resize(x,newsize);
    return;
  }
  goto joined_r0x00168b21;
}

Assistant:

void binbuf_text(t_binbuf *x, const char *text, size_t size)
{
    char buf[MAXPDSTRING+1], *bufp, *ebuf = buf+MAXPDSTRING;
    const char *textp = text, *etext = text+size;
    t_atom *ap;
    int nalloc = 16, natom = 0;
    binbuf_clear(x);
    if (!binbuf_resize(x, nalloc)) return;
    ap = x->b_vec;
    while (1)
    {
        int type;
            /* skip leading space */
        while ((textp != etext) && (*textp == ' ' || *textp == '\n'
            || *textp == '\r' || *textp == '\t')) textp++;
        if (textp == etext) break;
        if (*textp == ';') SETSEMI(ap), textp++;
        else if (*textp == ',') SETCOMMA(ap), textp++;
        else
        {
                /* it's an atom other than a comma or semi */
            char c;
            int floatstate = 0, slash = 0, lastslash = 0, dollar = 0;
            bufp = buf;
            do
            {
                c = *bufp = *textp++;
                lastslash = slash;
                slash = (c == '\\');

                if (floatstate >= 0)
                {
                    int digit = (c >= '0' && c <= '9'),
                        dot = (c == '.'), minus = (c == '-'),
                        plusminus = (minus || (c == '+')),
                        expon = (c == 'e' || c == 'E');
                    if (floatstate == 0)    /* beginning */
                    {
                        if (minus) floatstate = 1;
                        else if (digit) floatstate = 2;
                        else if (dot) floatstate = 3;
                        else floatstate = -1;
                    }
                    else if (floatstate == 1)   /* got minus */
                    {
                        if (digit) floatstate = 2;
                        else if (dot) floatstate = 3;
                        else floatstate = -1;
                    }
                    else if (floatstate == 2)   /* got digits */
                    {
                        if (dot) floatstate = 4;
                        else if (expon) floatstate = 6;
                        else if (!digit) floatstate = -1;
                    }
                    else if (floatstate == 3)   /* got '.' without digits */
                    {
                        if (digit) floatstate = 5;
                        else floatstate = -1;
                    }
                    else if (floatstate == 4)   /* got '.' after digits */
                    {
                        if (digit) floatstate = 5;
                        else if (expon) floatstate = 6;
                        else floatstate = -1;
                    }
                    else if (floatstate == 5)   /* got digits after . */
                    {
                        if (expon) floatstate = 6;
                        else if (!digit) floatstate = -1;
                    }
                    else if (floatstate == 6)   /* got 'e' */
                    {
                        if (plusminus) floatstate = 7;
                        else if (digit) floatstate = 8;
                        else floatstate = -1;
                    }
                    else if (floatstate == 7)   /* got plus or minus */
                    {
                        if (digit) floatstate = 8;
                        else floatstate = -1;
                    }
                    else if (floatstate == 8)   /* got digits */
                    {
                        if (!digit) floatstate = -1;
                    }
                }
                if (!lastslash && c == '$' && (textp != etext &&
                    textp[0] >= '0' && textp[0] <= '9'))
                        dollar = 1;
                if (!slash) bufp++;
                else if (lastslash)
                {
                    bufp++;
                    slash = 0;
                }
            }
            while (textp != etext && bufp != ebuf &&
                (slash || (*textp != ' ' && *textp != '\n' && *textp != '\r'
                    && *textp != '\t' &&*textp != ',' && *textp != ';')));
            *bufp = 0;
#if 0
            post("binbuf_text: buf %s", buf);
#endif
            if (floatstate == 2 || floatstate == 4 || floatstate == 5 ||
                floatstate == 8)
                    SETFLOAT(ap, atof(buf));
                /* LATER try to figure out how to mix "$" and "\$" correctly;
                here, the backslashes were already stripped so we assume all
                "$" chars are real dollars.  In fact, we only know at least one
                was. */
            else if (dollar)
            {
                if (buf[0] != '$')
                    dollar = 0;
                for (bufp = buf+1; *bufp; bufp++)
                    if (*bufp < '0' || *bufp > '9')
                        dollar = 0;
                if (dollar)
                    SETDOLLAR(ap, atoi(buf+1));
                else SETDOLLSYM(ap, gensym(buf));
            }
            else SETSYMBOL(ap, gensym(buf));
        }
        ap++;
        natom++;
        if (natom == nalloc)
        {
            if (!binbuf_resize(x, nalloc*2)) break;
            nalloc = nalloc * 2;
            ap = x->b_vec + natom;
        }
        if (textp == etext) break;
    }
    /* reallocate the vector to exactly the right size */
    binbuf_resize(x, natom);
}